

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned_long>
                   (appender out,write_int_arg<unsigned_long> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  type tVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> it_00;
  appender *paVar2;
  int *in_RCX;
  uint in_EDX;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_RSI;
  buffer<char> *in_RDI;
  format_specs<char> *in_R8;
  bool bVar3;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint prefix;
  unsigned_long abs_value;
  write_int_data<char> data;
  uint p;
  appender it;
  write_int_data<char> data_1;
  uint p_1;
  appender it_1;
  write_int_data<char> data_2;
  uint p_2;
  appender it_2;
  write_int_data<char> data_3;
  uint p_3;
  appender it_3;
  value_type_conflict1 *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc64;
  char in_stack_fffffffffffffc65;
  undefined1 in_stack_fffffffffffffc66;
  char in_stack_fffffffffffffc67;
  write_int_data<char> *this;
  undefined4 uStack_354;
  undefined4 uStack_2ec;
  uint local_2bc;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_2b8;
  int *local_2b0;
  buffer<char> *local_290;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_288;
  uint local_280;
  undefined8 local_278;
  undefined8 local_270;
  buffer<char> *local_268;
  int local_260;
  buffer<char> *local_258;
  undefined8 local_250;
  undefined8 local_248;
  buffer<char> *local_240;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_238;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_230;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_228;
  undefined1 local_21d;
  uint local_21c;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_218;
  int *local_210;
  uint local_208;
  int local_204;
  buffer<char> *local_200;
  int local_1f8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_1f0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_1e8;
  uint local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  buffer<char> *local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  buffer<char> *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  buffer<char> *local_1a0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_198;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_190;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_188;
  undefined1 local_17d;
  uint local_17c;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_178;
  int *local_170;
  uint local_168;
  int local_164;
  buffer<char> *local_160;
  undefined8 local_158;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_150;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_148;
  uint local_140;
  undefined8 local_138;
  undefined8 local_130;
  buffer<char> *local_128;
  int local_120;
  buffer<char> *local_118;
  undefined8 local_110;
  undefined8 local_108;
  buffer<char> *local_100;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_f8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_f0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_e8;
  undefined1 local_dd;
  uint local_dc;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_d8;
  int *local_d0;
  uint local_c8;
  int local_c4;
  buffer<char> *local_c0;
  int local_b8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_b0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_a8;
  uint local_a0;
  undefined8 local_98;
  undefined8 local_90;
  buffer<char> *local_88;
  int local_80;
  buffer<char> *local_78;
  undefined8 local_70;
  undefined8 local_68;
  buffer<char> *local_60;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_58;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_50;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_48;
  undefined1 local_3d;
  uint local_3c;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  int *local_30;
  uint local_28;
  int local_24;
  buffer<char> *local_20;
  int local_18;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_8;
  
  this = (write_int_data<char> *)CONCAT44(uStack_354,in_EDX);
  it_00.container = (buffer<char> *)(ulong)*(byte *)(in_RCX + 2);
  local_2bc = in_EDX;
  local_2b8.container = in_RSI.container;
  local_2b0 = in_RCX;
  local_290 = in_RDI;
  switch(it_00.container) {
  case (buffer<char> *)0x0:
  case (buffer<char> *)0x1:
    local_204 = count_digits(0x2b7557);
    local_1f0.container = local_290;
    local_200 = local_2b8.container;
    local_208 = local_2bc;
    local_210 = local_2b0;
    local_1f8 = local_204;
    if (*local_2b0 == 0 && local_2b0[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v10::appender>
                         ((appender *)&local_1f0,(ulong)(tVar1 + (local_208 >> 0x18)));
      local_218.container =
           (paVar2->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      if (local_208 != 0) {
        for (local_21c = local_208 & 0xffffff; local_21c != 0; local_21c = local_21c >> 8) {
          local_21d = (undefined1)local_21c;
          local_228.container = (buffer<char> *)appender::operator++((appender *)&local_218,0);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_228);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc67,
                              CONCAT16(in_stack_fffffffffffffc66,
                                       CONCAT15(in_stack_fffffffffffffc65,
                                                CONCAT14(in_stack_fffffffffffffc64,
                                                         in_stack_fffffffffffffc60)))),
                     in_stack_fffffffffffffc58);
        }
      }
      local_230.container = local_1f0.container;
      local_240 = local_218.container;
      local_238.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HSF[P]prmon/submodules/spdlog/include/spdlog/fmt/bundled/format.h:2200:41)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)in_R8,in_RSI.container);
      local_1e8.container =
           (buffer<char> *)
           base_iterator<fmt::v10::appender>(local_230.container,(appender)local_238.container);
    }
    else {
      write_int_data<char>::write_int_data
                (this,(int)((ulong)in_RSI.container >> 0x20),(uint)in_RSI.container,in_R8);
      local_258 = local_1f0.container;
      local_280 = local_208;
      local_278 = local_250;
      local_270 = local_248;
      local_268 = local_200;
      local_260 = local_1f8;
      local_1e8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_>
                     (in_RSI.container,in_R8,it_00.container,
                      (anon_class_40_3_03e05ccd *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))));
    }
    local_288.container = local_1e8.container;
    break;
  case (buffer<char> *)0x2:
    local_24 = count_digits<3,unsigned_long>
                         (CONCAT17(in_stack_fffffffffffffc67,
                                   CONCAT16(in_stack_fffffffffffffc66,
                                            CONCAT15(in_stack_fffffffffffffc65,
                                                     CONCAT14(in_stack_fffffffffffffc64,
                                                              in_stack_fffffffffffffc60)))));
    if ((((*(ushort *)((long)local_2b0 + 9) >> 7 & 1) != 0) && (local_2b0[1] <= local_24)) &&
       (local_2b8.container != (buffer<char> *)0x0)) {
      prefix_append(&local_2bc,0x30);
    }
    local_10.container = local_290;
    local_20 = local_2b8.container;
    local_28 = local_2bc;
    local_30 = local_2b0;
    local_18 = local_24;
    if (*local_2b0 == 0 && local_2b0[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v10::appender>
                         ((appender *)&local_10,(ulong)(tVar1 + (local_28 >> 0x18)));
      local_38.container =
           (paVar2->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      if (local_28 != 0) {
        for (local_3c = local_28 & 0xffffff; local_3c != 0; local_3c = local_3c >> 8) {
          local_3d = (undefined1)local_3c;
          local_48.container = (buffer<char> *)appender::operator++((appender *)&local_38,0);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_48);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc67,
                              CONCAT16(in_stack_fffffffffffffc66,
                                       CONCAT15(in_stack_fffffffffffffc65,
                                                CONCAT14(in_stack_fffffffffffffc64,
                                                         in_stack_fffffffffffffc60)))),
                     in_stack_fffffffffffffc58);
        }
      }
      local_50.container = local_10.container;
      local_60 = local_38.container;
      local_58.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HSF[P]prmon/submodules/spdlog/include/spdlog/fmt/bundled/format.h:2233:22)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))),
                      it_00.container);
      local_8.container =
           (buffer<char> *)
           base_iterator<fmt::v10::appender>(local_50.container,(appender)local_58.container);
    }
    else {
      write_int_data<char>::write_int_data
                (this,(int)((ulong)in_RSI.container >> 0x20),(uint)in_RSI.container,in_R8);
      local_78 = local_10.container;
      local_a0 = local_28;
      local_98 = local_70;
      local_90 = local_68;
      local_88 = local_20;
      local_80 = local_18;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_>
                     (in_RSI.container,in_R8,it_00.container,
                      (anon_class_40_3_03e05ccd *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))));
    }
    local_288.container = local_8.container;
    break;
  case (buffer<char> *)0x3:
  case (buffer<char> *)0x4:
    bVar3 = (char)in_RCX[2] == '\x04';
    if ((*(ushort *)((long)in_RCX + 9) >> 7 & 1) != 0) {
      in_stack_fffffffffffffc66 = 0x78;
      in_stack_fffffffffffffc67 = 'X';
      if (!bVar3) {
        in_stack_fffffffffffffc67 = 'x';
      }
      prefix_append(&local_2bc,(int)in_stack_fffffffffffffc67 << 8 | 0x30);
    }
    local_164 = count_digits<4,unsigned_long>
                          (CONCAT17(in_stack_fffffffffffffc67,
                                    CONCAT16(in_stack_fffffffffffffc66,
                                             CONCAT15(in_stack_fffffffffffffc65,
                                                      CONCAT14(in_stack_fffffffffffffc64,
                                                               in_stack_fffffffffffffc60)))));
    uStack_2ec = CONCAT31(uStack_2ec._1_3_,bVar3);
    local_158 = CONCAT44(uStack_2ec,local_164);
    local_150.container = local_290;
    local_160 = local_2b8.container;
    local_168 = local_2bc;
    local_170 = local_2b0;
    if (*local_2b0 == 0 && local_2b0[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v10::appender>
                         ((appender *)&local_150,(ulong)(tVar1 + (local_168 >> 0x18)));
      local_178.container =
           (paVar2->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      if (local_168 != 0) {
        for (local_17c = local_168 & 0xffffff; local_17c != 0; local_17c = local_17c >> 8) {
          local_17d = (undefined1)local_17c;
          local_188.container = (buffer<char> *)appender::operator++((appender *)&local_178,0);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_188);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc67,
                              CONCAT16(in_stack_fffffffffffffc66,
                                       CONCAT15(in_stack_fffffffffffffc65,
                                                CONCAT14(in_stack_fffffffffffffc64,
                                                         in_stack_fffffffffffffc60)))),
                     in_stack_fffffffffffffc58);
        }
      }
      local_190.container = local_150.container;
      local_1a0 = local_178.container;
      local_198.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HSF[P]prmon/submodules/spdlog/include/spdlog/fmt/bundled/format.h:2211:41)>
           ::anon_class_40_3_03e05ccd::anon_class_16_3_9e397504_for_write_digits::operator()
                     ((anon_class_16_3_9e397504_for_write_digits *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))),
                      it_00.container);
      local_148.container =
           (buffer<char> *)
           base_iterator<fmt::v10::appender>(local_190.container,(appender)local_198.container);
    }
    else {
      write_int_data<char>::write_int_data
                (this,(int)((ulong)in_RSI.container >> 0x20),(uint)in_RSI.container,in_R8);
      local_1b8 = local_150.container;
      local_1e0 = local_168;
      local_1d8 = local_1b0;
      local_1d0 = local_1a8;
      local_1c8 = local_160;
      local_1c0 = (undefined4)local_158;
      local_1bc = local_158._4_1_;
      local_148.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_>
                     (in_RSI.container,in_R8,it_00.container,
                      (anon_class_40_3_03e05ccd_conflict *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))));
    }
    local_288.container = local_148.container;
    break;
  case (buffer<char> *)0x5:
  case (buffer<char> *)0x6:
    if ((*(ushort *)((long)in_RCX + 9) >> 7 & 1) != 0) {
      in_stack_fffffffffffffc64 = 0x62;
      in_stack_fffffffffffffc65 = 'B';
      if ((char)in_RCX[2] != '\x06') {
        in_stack_fffffffffffffc65 = 'b';
      }
      prefix_append(&local_2bc,(int)in_stack_fffffffffffffc65 << 8 | 0x30);
    }
    local_c4 = count_digits<1,unsigned_long>
                         (CONCAT17(in_stack_fffffffffffffc67,
                                   CONCAT16(in_stack_fffffffffffffc66,
                                            CONCAT15(in_stack_fffffffffffffc65,
                                                     CONCAT14(in_stack_fffffffffffffc64,
                                                              in_stack_fffffffffffffc60)))));
    local_b0.container = local_290;
    local_c0 = local_2b8.container;
    local_c8 = local_2bc;
    local_d0 = local_2b0;
    local_b8 = local_c4;
    if (*local_2b0 == 0 && local_2b0[1] == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v10::appender>
                         ((appender *)&local_b0,(ulong)(tVar1 + (local_c8 >> 0x18)));
      local_d8.container =
           (paVar2->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      if (local_c8 != 0) {
        for (local_dc = local_c8 & 0xffffff; local_dc != 0; local_dc = local_dc >> 8) {
          local_dd = (undefined1)local_dc;
          local_e8.container = (buffer<char> *)appender::operator++((appender *)&local_d8,0);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_e8);
          std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc67,
                              CONCAT16(in_stack_fffffffffffffc66,
                                       CONCAT15(in_stack_fffffffffffffc65,
                                                CONCAT14(in_stack_fffffffffffffc64,
                                                         in_stack_fffffffffffffc60)))),
                     in_stack_fffffffffffffc58);
        }
      }
      local_f0.container = local_b0.container;
      local_100 = local_d8.container;
      local_f8.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HSF[P]prmon/submodules/spdlog/include/spdlog/fmt/bundled/format.h:2222:22)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))),
                      it_00.container);
      local_a8.container =
           (buffer<char> *)
           base_iterator<fmt::v10::appender>(local_f0.container,(appender)local_f8.container);
    }
    else {
      write_int_data<char>::write_int_data
                (this,(int)((ulong)in_RSI.container >> 0x20),(uint)in_RSI.container,in_R8);
      local_118 = local_b0.container;
      local_140 = local_c8;
      local_138 = local_110;
      local_130 = local_108;
      local_128 = local_c0;
      local_120 = local_b8;
      local_a8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_>
                     (in_RSI.container,in_R8,it_00.container,
                      (anon_class_40_3_03e05ccd *)
                      CONCAT17(in_stack_fffffffffffffc67,
                               CONCAT16(in_stack_fffffffffffffc66,
                                        CONCAT15(in_stack_fffffffffffffc65,
                                                 CONCAT14(in_stack_fffffffffffffc64,
                                                          in_stack_fffffffffffffc60)))));
    }
    local_288.container = local_a8.container;
    break;
  default:
    throw_format_error((char *)in_R8);
  case (buffer<char> *)0xf:
    local_288.container =
         (buffer<char> *)
         write_char<char,fmt::v10::appender>
                   (in_RSI.container,(char)((ulong)in_R8 >> 0x38),
                    (format_specs<char> *)it_00.container);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_288.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}